

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void print_string(flatcc_json_printer_t *ctx,char *s,size_t n)

{
  byte *pbVar1;
  byte c;
  char *pcVar2;
  ulong __n;
  ulong uVar3;
  char *__dest;
  size_t __n_00;
  byte *pbVar4;
  
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '\"';
  pbVar4 = (byte *)s;
  while( true ) {
    c = *pbVar4;
    while (((0x1f < c && (c != 0x22)) && (c != 0x5c))) {
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      c = *pbVar1;
    }
    __n = (long)pbVar4 - (long)s;
    pcVar2 = ctx->pflush;
    __dest = ctx->p;
    uVar3 = __n;
    if (__dest + __n < pcVar2) {
      memcpy(__dest,s,__n);
    }
    else {
      if (pcVar2 <= __dest) {
        (*ctx->flush)(ctx,0);
        pcVar2 = ctx->pflush;
        __dest = ctx->p;
      }
      __n_00 = (long)pcVar2 - (long)__dest;
      pcVar2 = s;
      if (__n_00 < __n) {
        do {
          memcpy(__dest,pcVar2,__n_00);
          ctx->p = ctx->p + __n_00;
          pcVar2 = pcVar2 + __n_00;
          uVar3 = uVar3 - __n_00;
          (*ctx->flush)(ctx,0);
          __dest = ctx->p;
          __n_00 = (long)ctx->pflush - (long)__dest;
        } while (__n_00 < uVar3);
      }
      memcpy(__dest,pcVar2,uVar3);
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + uVar3;
    if (n == __n) break;
    print_escape(ctx,c);
    pbVar4 = pbVar4 + 1;
    s = s + __n + 1;
    n = n + ~__n;
  }
  pcVar2 = pcVar2 + uVar3;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '\"';
  return;
}

Assistant:

static void print_string(flatcc_json_printer_t *ctx, const char *s, size_t n)
{
    const char *p = s;
    /* Unsigned is important. */
    unsigned char c;
    size_t k;

    print_char('\"');
    for (;;) {
        c = (unsigned char)*p;
        while (c >= 0x20 && c != '\"' && c != '\\') {
            c = (unsigned char)*++p;
        }
        k = (size_t)(p - s);
        /* Even if k == 0, print ensures buffer flush. */
        print(ctx, s, k);
        n -= k;
        if (n == 0) break;
        s += k;
        print_escape(ctx, c);
        ++p;
        --n;
        ++s;
    }
    print_char('\"');
}